

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O3

void __thiscall
ki::dml::
Field<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
::from_xml(Field<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
           *this,xml_node<char> *node)

{
  int iVar1;
  ostream *poVar2;
  value_error *pvVar3;
  char *pcVar4;
  char *pcVar5;
  xml_attribute<char> *pxVar6;
  string name;
  string value_2;
  string value;
  char *local_248;
  long local_240;
  char local_238 [16];
  char *local_228;
  long local_220;
  char local_218 [16];
  string local_208;
  string local_1e8;
  string local_1c8;
  char *local_1a8;
  long local_1a0;
  char local_198 [360];
  
  pcVar5 = (node->super_xml_base<char>).m_name;
  if (pcVar5 == (char *)0x0) {
    pcVar5 = &rapidxml::xml_base<char>::nullstr()::zero;
  }
  pcVar4 = (char *)(this->super_FieldBase).m_name._M_string_length;
  strlen(pcVar5);
  std::__cxx11::string::_M_replace((ulong)&(this->super_FieldBase).m_name,0,pcVar4,(ulong)pcVar5);
  (this->super_FieldBase).m_transferable = true;
  pxVar6 = node->m_first_attribute;
  if (pxVar6 != (xml_attribute<char> *)0x0) {
    do {
      pcVar5 = (pxVar6->super_xml_base<char>).m_name;
      if (pcVar5 == (char *)0x0) {
        pcVar5 = &rapidxml::xml_base<char>::nullstr()::zero;
      }
      std::__cxx11::string::string((string *)&local_248,pcVar5,(allocator *)&local_1a8);
      iVar1 = std::__cxx11::string::compare((char *)&local_248);
      if (iVar1 == 0) {
        pcVar5 = (pxVar6->super_xml_base<char>).m_value;
        if (pcVar5 == (char *)0x0) {
          pcVar5 = &rapidxml::xml_base<char>::nullstr()::zero;
        }
        std::__cxx11::string::string((string *)&local_228,pcVar5,(allocator *)&local_1a8);
        get_type_name(this);
        iVar1 = std::__cxx11::string::compare((char *)&local_228);
        if (iVar1 != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,"XML Field node has incorrect TYPE attribute value. ",
                     0x33);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"(value=\"",8);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_1a8,local_228,local_220);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\", expected=\"",0xd);
          pcVar5 = get_type_name(this);
          poVar2 = std::operator<<(poVar2,pcVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\". ",3);
          pvVar3 = (value_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          value_error::value_error(pvVar3,&local_1c8);
          __cxa_throw(pvVar3,&value_error::typeinfo,std::runtime_error::~runtime_error);
        }
        pcVar5 = local_218;
        pcVar4 = local_228;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)&local_248);
        if (iVar1 != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,"XML Field node has unknown attribute \"",0x26);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_1a8,local_248,local_240);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\".",2);
          pvVar3 = (value_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          value_error::value_error(pvVar3,&local_1e8);
          __cxa_throw(pvVar3,&value_error::typeinfo,std::runtime_error::~runtime_error);
        }
        pcVar5 = (pxVar6->super_xml_base<char>).m_value;
        if (pcVar5 == (char *)0x0) {
          pcVar5 = &rapidxml::xml_base<char>::nullstr()::zero;
        }
        std::__cxx11::string::string((string *)&local_1a8,pcVar5,(allocator *)&local_228);
        iVar1 = std::__cxx11::string::compare((char *)&local_1a8);
        (this->super_FieldBase).m_transferable = iVar1 != 0;
        pcVar5 = local_198;
        pcVar4 = local_1a8;
      }
      if (pcVar4 != pcVar5) {
        operator_delete(pcVar4);
      }
      if (local_248 != local_238) {
        operator_delete(local_248);
      }
    } while (((pxVar6->super_xml_base<char>).m_parent != (xml_node<char> *)0x0) &&
            (pxVar6 = pxVar6->m_next_attribute, pxVar6 != (xml_attribute<char> *)0x0));
  }
  pcVar5 = (node->super_xml_base<char>).m_value;
  if (pcVar5 == (char *)0x0) {
    pcVar5 = &rapidxml::xml_base<char>::nullstr()::zero;
  }
  std::__cxx11::string::string((string *)&local_1a8,pcVar5,(allocator *)&local_248);
  if (local_1a0 != 0) {
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_208,local_1a8,local_1a8 + local_1a0);
    set_value_from_string(this,&local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p);
    }
  }
  if (local_1a8 != local_198) {
    operator_delete(local_1a8);
  }
  return;
}

Assistant:

void from_xml(const rapidxml::xml_node<> *node) final
		{
			// Use the name of the node as the field name and,
			// default transferable to TRUE.
			m_name = node->name();
			m_transferable = true;

			for (auto *attr = node->first_attribute();
				attr; attr = attr->next_attribute())
			{
				const std::string name = attr->name();
				if (name == "TYPE")
				{
					const std::string value = attr->value();
					if (value != get_type_name())
					{
						std::ostringstream oss;
						oss << "XML Field node has incorrect TYPE attribute value. ";
						oss << "(value=\"" << value << "\", expected=\"" << get_type_name() << "\". ";
						throw value_error(oss.str());
					}
				}
				else if (name == "NOXFER")
				{
					const std::string value = attr->value();
					m_transferable = value != "TRUE";
				}
				else
				{
					std::ostringstream oss;
					oss << "XML Field node has unknown attribute \"" << name << "\".";
					throw value_error(oss.str());
				}
			}

			const std::string value = node->value();
			if (!value.empty())
				set_value_from_string(value);
		}